

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O2

Normalizer2 * icu_63::Normalizer2Factory::getNoopInstance(UErrorCode *errorCode)

{
  if (U_ZERO_ERROR < *errorCode) {
    return (Normalizer2 *)0x0;
  }
  umtx_initOnce((UInitOnce *)&noopInitOnce,initNoopSingleton,errorCode);
  return noopSingleton;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }